

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

bool __thiscall cmGlobalGenerator::Compute(cmGlobalGenerator *this)

{
  cmLocalGenerator *this_00;
  bool bVar1;
  uint uVar2;
  cmMakefile *this_01;
  vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_> *this_02;
  reference ppcVar3;
  reference ppcVar4;
  cmLocalGenerator *localGen_5;
  iterator __end1_5;
  iterator __begin1_5;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *__range1_5;
  cmLocalGenerator *localGen_4;
  iterator __end1_4;
  iterator __begin1_4;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *__range1_4;
  cmLocalGenerator *localGen_3;
  iterator __end1_3;
  iterator __begin1_3;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *__range1_3;
  cmInstallGenerator *g;
  iterator __end2;
  iterator __begin2;
  vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_> *__range2;
  cmMakefile *mf;
  cmLocalGenerator *localGen_2;
  iterator __end1_2;
  iterator __begin1_2;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *__range1_2;
  cmLocalGenerator *localGen_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *__range1_1;
  cmLocalGenerator *localGen;
  iterator __end1;
  iterator __begin1;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *__range1;
  cmGlobalGenerator *this_local;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->FilesReplacedDuringGenerate);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->CMP0042WarnTargets);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->CMP0068WarnTargets);
  uVar2 = (*this->_vptr_cmGlobalGenerator[0x30])();
  if ((uVar2 & 1) == 0) {
    this_local._7_1_ = false;
  }
  else {
    FinalizeTargetCompileInfo(this);
    CreateGenerationObjects(this,AllTargets);
    FillProjectMap(this);
    bVar1 = QtAutoGen(this);
    if (bVar1) {
      __end1 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::begin
                         (&this->LocalGenerators);
      localGen = (cmLocalGenerator *)
                 std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::end
                           (&this->LocalGenerators);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end1,(__normal_iterator<cmLocalGenerator_**,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                                         *)&localGen), bVar1) {
        ppcVar4 = __gnu_cxx::
                  __normal_iterator<cmLocalGenerator_**,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                  ::operator*(&__end1);
        (*(*ppcVar4)->_vptr_cmLocalGenerator[4])();
        __gnu_cxx::
        __normal_iterator<cmLocalGenerator_**,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
        ::operator++(&__end1);
      }
      __end1_1 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::begin
                           (&this->LocalGenerators);
      localGen_1 = (cmLocalGenerator *)
                   std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::end
                             (&this->LocalGenerators);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end1_1,
                                (__normal_iterator<cmLocalGenerator_**,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                                 *)&localGen_1), bVar1) {
        ppcVar4 = __gnu_cxx::
                  __normal_iterator<cmLocalGenerator_**,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                  ::operator*(&__end1_1);
        bVar1 = cmLocalGenerator::ComputeTargetCompileFeatures(*ppcVar4);
        if (!bVar1) {
          return false;
        }
        __gnu_cxx::
        __normal_iterator<cmLocalGenerator_**,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
        ::operator++(&__end1_1);
      }
      __end1_2 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::begin
                           (&this->LocalGenerators);
      localGen_2 = (cmLocalGenerator *)
                   std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::end
                             (&this->LocalGenerators);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end1_2,
                                (__normal_iterator<cmLocalGenerator_**,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                                 *)&localGen_2), bVar1) {
        ppcVar4 = __gnu_cxx::
                  __normal_iterator<cmLocalGenerator_**,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                  ::operator*(&__end1_2);
        this_00 = *ppcVar4;
        this_01 = cmLocalGenerator::GetMakefile(this_00);
        this_02 = cmMakefile::GetInstallGenerators(this_01);
        __end2 = std::vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>::begin
                           (this_02);
        g = (cmInstallGenerator *)
            std::vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>::end(this_02);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end2,(__normal_iterator<cmInstallGenerator_**,_std::vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>_>
                                           *)&g), bVar1) {
          ppcVar3 = __gnu_cxx::
                    __normal_iterator<cmInstallGenerator_**,_std::vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>_>
                    ::operator*(&__end2);
          (*((*ppcVar3)->super_cmScriptGenerator)._vptr_cmScriptGenerator[10])(*ppcVar3,this_00);
          __gnu_cxx::
          __normal_iterator<cmInstallGenerator_**,_std::vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>_>
          ::operator++(&__end2);
        }
        __gnu_cxx::
        __normal_iterator<cmLocalGenerator_**,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
        ::operator++(&__end1_2);
      }
      (*this->_vptr_cmGlobalGenerator[0xc])();
      __end1_3 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::begin
                           (&this->LocalGenerators);
      localGen_3 = (cmLocalGenerator *)
                   std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::end
                             (&this->LocalGenerators);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end1_3,
                                (__normal_iterator<cmLocalGenerator_**,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                                 *)&localGen_3), bVar1) {
        ppcVar4 = __gnu_cxx::
                  __normal_iterator<cmLocalGenerator_**,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                  ::operator*(&__end1_3);
        cmLocalGenerator::TraceDependencies(*ppcVar4);
        __gnu_cxx::
        __normal_iterator<cmLocalGenerator_**,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
        ::operator++(&__end1_3);
      }
      bVar1 = CheckTargetsForMissingSources(this);
      if (bVar1) {
        this_local._7_1_ = false;
      }
      else {
        (*this->_vptr_cmGlobalGenerator[0x32])();
        __end1_4 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::begin
                             (&this->LocalGenerators);
        localGen_4 = (cmLocalGenerator *)
                     std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::end
                               (&this->LocalGenerators);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end1_4,
                                  (__normal_iterator<cmLocalGenerator_**,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                                   *)&localGen_4), bVar1) {
          ppcVar4 = __gnu_cxx::
                    __normal_iterator<cmLocalGenerator_**,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                    ::operator*(&__end1_4);
          cmLocalGenerator::ComputeTargetManifest(*ppcVar4);
          __gnu_cxx::
          __normal_iterator<cmLocalGenerator_**,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
          ::operator++(&__end1_4);
        }
        uVar2 = (*this->_vptr_cmGlobalGenerator[0x2f])();
        if ((uVar2 & 1) == 0) {
          this_local._7_1_ = false;
        }
        else {
          __end1_5 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::begin
                               (&this->LocalGenerators);
          localGen_5 = (cmLocalGenerator *)
                       std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::end
                                 (&this->LocalGenerators);
          while (bVar1 = __gnu_cxx::operator!=
                                   (&__end1_5,
                                    (__normal_iterator<cmLocalGenerator_**,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                                     *)&localGen_5), bVar1) {
            ppcVar4 = __gnu_cxx::
                      __normal_iterator<cmLocalGenerator_**,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                      ::operator*(&__end1_5);
            (*(*ppcVar4)->_vptr_cmLocalGenerator[3])();
            __gnu_cxx::
            __normal_iterator<cmLocalGenerator_**,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
            ::operator++(&__end1_5);
          }
          this_local._7_1_ = true;
        }
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool cmGlobalGenerator::Compute()
{
  // Some generators track files replaced during the Generate.
  // Start with an empty vector:
  this->FilesReplacedDuringGenerate.clear();

  // clear targets to issue warning CMP0042 for
  this->CMP0042WarnTargets.clear();
  // clear targets to issue warning CMP0068 for
  this->CMP0068WarnTargets.clear();

  // Check whether this generator is allowed to run.
  if (!this->CheckALLOW_DUPLICATE_CUSTOM_TARGETS()) {
    return false;
  }
  this->FinalizeTargetCompileInfo();

  this->CreateGenerationObjects();

  // at this point this->LocalGenerators has been filled,
  // so create the map from project name to vector of local generators
  this->FillProjectMap();

  // Iterate through all targets and set up AUTOMOC, AUTOUIC and AUTORCC
  if (!this->QtAutoGen()) {
    return false;
  }

  // Add generator specific helper commands
  for (cmLocalGenerator* localGen : this->LocalGenerators) {
    localGen->AddHelperCommands();
  }

  // Finalize the set of compile features for each target.
  // FIXME: This turns into calls to cmMakefile::AddRequiredTargetFeature
  // which actually modifies the <lang>_STANDARD target property
  // on the original cmTarget instance.  It accumulates features
  // across all configurations.  Some refactoring is needed to
  // compute a per-config resulta purely during generation.
  for (cmLocalGenerator* localGen : this->LocalGenerators) {
    if (!localGen->ComputeTargetCompileFeatures()) {
      return false;
    }
  }

  for (cmLocalGenerator* localGen : this->LocalGenerators) {
    cmMakefile* mf = localGen->GetMakefile();
    for (cmInstallGenerator* g : mf->GetInstallGenerators()) {
      g->Compute(localGen);
    }
  }

  this->AddExtraIDETargets();

  // Trace the dependencies, after that no custom commands should be added
  // because their dependencies might not be handled correctly
  for (cmLocalGenerator* localGen : this->LocalGenerators) {
    localGen->TraceDependencies();
  }

  // Make sure that all (non-imported) targets have source files added!
  if (this->CheckTargetsForMissingSources()) {
    return false;
  }

  this->ForceLinkerLanguages();

  // Compute the manifest of main targets generated.
  for (cmLocalGenerator* localGen : this->LocalGenerators) {
    localGen->ComputeTargetManifest();
  }

  // Compute the inter-target dependencies.
  if (!this->ComputeTargetDepends()) {
    return false;
  }

  for (cmLocalGenerator* localGen : this->LocalGenerators) {
    localGen->ComputeHomeRelativeOutputPath();
  }

  return true;
}